

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O1

void google::protobuf::internal::TcParser::WriteVarintToUnknown<google::protobuf::UnknownFieldSet>
               (MessageLite *msg,int number,int value)

{
  ulong uVar1;
  UnknownFieldSet *this;
  
  uVar1 = (msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    this = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                     (&msg->_internal_metadata_);
  }
  else {
    this = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  UnknownFieldSet::AddVarint(this,number,(long)value);
  return;
}

Assistant:

static void WriteVarintToUnknown(MessageLite* msg, int number, int value) {
    internal::WriteVarint(
        number, value,
        msg->_internal_metadata_.mutable_unknown_fields<UnknownFieldsT>());
  }